

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O0

void __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::InfiniteImpulseResponseDigitalFilter
          (InfiniteImpulseResponseDigitalFilter *this,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *numerator_coefficients)

{
  size_type sVar1;
  int *piVar2;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__InfiniteImpulseResponseDigitalFilter_0012acc8;
  std::vector<double,_std::allocator<double>_>::vector(in_RSI,in_RDX);
  std::vector<double,_std::allocator<double>_>::vector(in_RSI,in_RDX);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  *(int *)(in_RDI + 7) = (int)sVar1 + -1;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  *(int *)((long)in_RDI + 0x3c) = (int)sVar1 + -1;
  piVar2 = std::max<int>((int *)(in_RDI + 7),(int *)((long)in_RDI + 0x3c));
  *(int *)(in_RDI + 8) = *piVar2;
  *(undefined1 *)((long)in_RDI + 0x44) = 1;
  if ((*(int *)(in_RDI + 7) < 0) || (*(int *)((long)in_RDI + 0x3c) < 0)) {
    *(undefined1 *)((long)in_RDI + 0x44) = 0;
  }
  return;
}

Assistant:

InfiniteImpulseResponseDigitalFilter::InfiniteImpulseResponseDigitalFilter(
    const std::vector<double>& denominator_coefficients,
    const std::vector<double>& numerator_coefficients)
    : denominator_coefficients_(denominator_coefficients),
      numerator_coefficients_(numerator_coefficients),
      num_denominator_order_(static_cast<int>(denominator_coefficients.size()) -
                             1),
      num_numerator_order_(static_cast<int>(numerator_coefficients.size()) - 1),
      num_filter_order_(std::max(num_denominator_order_, num_numerator_order_)),
      is_valid_(true) {
  if (num_denominator_order_ < 0 || num_numerator_order_ < 0) {
    is_valid_ = false;
    return;
  }
}